

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::sse42::SubdivPatch1MBIntersectorK<4>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  GridSOA *pGVar1;
  GridSOA *pGVar2;
  GridSOA *pGVar3;
  GridSOA *pGVar4;
  GridSOA *pGVar5;
  GridSOA *pGVar6;
  GridSOA *pGVar7;
  GridSOA *pGVar8;
  float *pfVar9;
  GridSOA *pGVar10;
  GridSOA *pGVar11;
  GridSOA *pGVar12;
  float *pfVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  int iVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  GridSOA *pGVar24;
  Geometry *pGVar25;
  RTCFilterFunctionN p_Var26;
  size_t sVar27;
  long lVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  long lVar38;
  AABBNodeMB4D *node1;
  ulong uVar39;
  uint uVar40;
  int iVar41;
  ulong uVar42;
  GridSOA *pGVar43;
  ulong uVar44;
  ulong uVar45;
  GridSOA *pGVar46;
  ulong uVar47;
  ulong uVar48;
  bool bVar49;
  float fVar50;
  float fVar51;
  undefined1 auVar52 [12];
  undefined1 auVar53 [12];
  float fVar70;
  float fVar71;
  float fVar72;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar73;
  undefined1 auVar74 [12];
  undefined1 auVar75 [12];
  float fVar84;
  undefined1 in_XMM1 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  float fVar85;
  float fVar86;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar87;
  float fVar95;
  float fVar96;
  undefined1 auVar88 [16];
  float fVar97;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  float fVar102;
  float fVar105;
  float fVar106;
  undefined1 auVar103 [16];
  float fVar107;
  undefined1 auVar104 [16];
  float fVar108;
  float fVar110;
  undefined1 auVar109 [16];
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  undefined1 auVar117 [16];
  float fVar125;
  undefined1 auVar118 [16];
  float fVar126;
  float fVar130;
  uint uVar131;
  float fVar132;
  uint uVar133;
  float fVar134;
  uint uVar135;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  float fVar136;
  float fVar137;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  undefined1 auVar138 [16];
  float fVar145;
  float fVar150;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  float fVar151;
  float fVar155;
  float fVar156;
  float fVar157;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  float fVar158;
  float fVar159;
  float fVar163;
  float fVar165;
  undefined1 auVar160 [16];
  float fVar164;
  float fVar166;
  float fVar167;
  float fVar168;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar185;
  float fVar186;
  float fVar188;
  float fVar189;
  float fVar192;
  float fVar193;
  undefined1 auVar181 [16];
  float fVar180;
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  float fVar187;
  float fVar190;
  float fVar191;
  float fVar194;
  float fVar195;
  undefined1 auVar184 [16];
  undefined8 local_b58;
  float fStack_b4c;
  float local_b48;
  float fStack_b44;
  float fStack_b40;
  float fStack_b3c;
  float old_t_1;
  float fStack_b34;
  undefined8 uStack_b30;
  float fStack_b1c;
  undefined8 local_b18;
  float fStack_b0c;
  float old_t;
  float fStack_a74;
  float fStack_a70;
  float fStack_a6c;
  undefined4 uStack_a5c;
  undefined1 local_a58 [16];
  NodeRef *local_a40;
  Precalculations *local_a38;
  GridSOA *local_a30;
  ulong local_a28;
  ulong local_a20;
  float local_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  undefined1 (*local_a08) [12];
  ulong local_a00;
  RTCFilterFunctionNArguments args;
  float local_8e8 [4];
  float local_8d8 [4];
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [16];
  undefined1 local_8a8 [16];
  undefined1 local_898 [16];
  undefined4 local_888;
  undefined4 uStack_884;
  undefined4 uStack_880;
  undefined4 uStack_87c;
  undefined1 local_878 [16];
  undefined1 local_868 [16];
  float local_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  undefined1 local_848 [16];
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  uint local_818;
  uint uStack_814;
  uint uStack_810;
  uint uStack_80c;
  uint local_808;
  uint uStack_804;
  uint uStack_800;
  uint uStack_7fc;
  float local_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float local_7e8;
  float fStack_7e4;
  float fStack_7e0;
  float fStack_7dc;
  NodeRef stack [244];
  undefined1 auVar91 [16];
  undefined1 auVar94 [16];
  undefined1 auVar146 [16];
  
  local_a40 = stack + 1;
  stack[0] = root;
  fVar14 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar15 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar16 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar17 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar18 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar19 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar47 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar45 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar48 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar20 = (tray->tnear).field_0.i[k];
  auVar160._4_4_ = iVar20;
  auVar160._0_4_ = iVar20;
  auVar160._8_4_ = iVar20;
  auVar160._12_4_ = iVar20;
  iVar20 = (tray->tfar).field_0.i[k];
  local_a08 = (undefined1 (*) [12])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  bVar49 = true;
  local_a38 = pre;
  do {
    uVar42 = local_a40[-1].ptr;
    local_a40 = local_a40 + -1;
    while ((uVar42 & 8) == 0) {
      uVar39 = uVar42 & 0xfffffffffffffff0;
      fVar50 = *(float *)(ray + k * 4 + 0x70);
      pfVar13 = (float *)(uVar39 + 0x80 + uVar47);
      pfVar9 = (float *)(uVar39 + 0x20 + uVar47);
      auVar76._0_4_ = ((*pfVar13 * fVar50 + *pfVar9) - fVar14) * fVar17;
      auVar76._4_4_ = ((pfVar13[1] * fVar50 + pfVar9[1]) - fVar14) * fVar17;
      auVar76._8_4_ = ((pfVar13[2] * fVar50 + pfVar9[2]) - fVar14) * fVar17;
      auVar76._12_4_ = ((pfVar13[3] * fVar50 + pfVar9[3]) - fVar14) * fVar17;
      auVar76 = maxps(auVar160,auVar76);
      pfVar13 = (float *)(uVar39 + 0x80 + uVar45);
      pfVar9 = (float *)(uVar39 + 0x20 + uVar45);
      auVar88._0_4_ = ((*pfVar13 * fVar50 + *pfVar9) - fVar15) * fVar18;
      auVar88._4_4_ = ((pfVar13[1] * fVar50 + pfVar9[1]) - fVar15) * fVar18;
      auVar88._8_4_ = ((pfVar13[2] * fVar50 + pfVar9[2]) - fVar15) * fVar18;
      auVar88._12_4_ = ((pfVar13[3] * fVar50 + pfVar9[3]) - fVar15) * fVar18;
      pfVar13 = (float *)(uVar39 + 0x80 + uVar48);
      pfVar9 = (float *)(uVar39 + 0x20 + uVar48);
      auVar128._0_4_ = ((*pfVar13 * fVar50 + *pfVar9) - fVar16) * fVar19;
      auVar128._4_4_ = ((pfVar13[1] * fVar50 + pfVar9[1]) - fVar16) * fVar19;
      auVar128._8_4_ = ((pfVar13[2] * fVar50 + pfVar9[2]) - fVar16) * fVar19;
      auVar128._12_4_ = ((pfVar13[3] * fVar50 + pfVar9[3]) - fVar16) * fVar19;
      auVar88 = maxps(auVar88,auVar128);
      auVar76 = maxps(auVar76,auVar88);
      pfVar13 = (float *)(uVar39 + 0x80 + (uVar47 ^ 0x10));
      pfVar9 = (float *)(uVar39 + 0x20 + (uVar47 ^ 0x10));
      auVar183._0_4_ = ((*pfVar13 * fVar50 + *pfVar9) - fVar14) * fVar17;
      auVar183._4_4_ = ((pfVar13[1] * fVar50 + pfVar9[1]) - fVar14) * fVar17;
      auVar183._8_4_ = ((pfVar13[2] * fVar50 + pfVar9[2]) - fVar14) * fVar17;
      auVar183._12_4_ = ((pfVar13[3] * fVar50 + pfVar9[3]) - fVar14) * fVar17;
      auVar99._4_4_ = iVar20;
      auVar99._0_4_ = iVar20;
      auVar99._8_4_ = iVar20;
      auVar99._12_4_ = iVar20;
      auVar88 = minps(auVar99,auVar183);
      pfVar13 = (float *)(uVar39 + 0x80 + (uVar45 ^ 0x10));
      pfVar9 = (float *)(uVar39 + 0x20 + (uVar45 ^ 0x10));
      auVar98._0_4_ = ((*pfVar13 * fVar50 + *pfVar9) - fVar15) * fVar18;
      auVar98._4_4_ = ((pfVar13[1] * fVar50 + pfVar9[1]) - fVar15) * fVar18;
      auVar98._8_4_ = ((pfVar13[2] * fVar50 + pfVar9[2]) - fVar15) * fVar18;
      auVar98._12_4_ = ((pfVar13[3] * fVar50 + pfVar9[3]) - fVar15) * fVar18;
      pfVar13 = (float *)(uVar39 + 0x80 + (uVar48 ^ 0x10));
      pfVar9 = (float *)(uVar39 + 0x20 + (uVar48 ^ 0x10));
      auVar103._0_4_ = ((*pfVar13 * fVar50 + *pfVar9) - fVar16) * fVar19;
      auVar103._4_4_ = ((pfVar13[1] * fVar50 + pfVar9[1]) - fVar16) * fVar19;
      auVar103._8_4_ = ((pfVar13[2] * fVar50 + pfVar9[2]) - fVar16) * fVar19;
      auVar103._12_4_ = ((pfVar13[3] * fVar50 + pfVar9[3]) - fVar16) * fVar19;
      auVar99 = minps(auVar98,auVar103);
      auVar88 = minps(auVar88,auVar99);
      uVar40 = (uint)uVar42 & 7;
      bVar29 = auVar76._0_4_ <= auVar88._0_4_;
      bVar30 = auVar76._4_4_ <= auVar88._4_4_;
      bVar31 = auVar76._8_4_ <= auVar88._8_4_;
      bVar32 = auVar76._12_4_ <= auVar88._12_4_;
      if (uVar40 == 6) {
        bVar29 = (fVar50 < *(float *)(uVar39 + 0xf0) && *(float *)(uVar39 + 0xe0) <= fVar50) &&
                 bVar29;
        bVar30 = (fVar50 < *(float *)(uVar39 + 0xf4) && *(float *)(uVar39 + 0xe4) <= fVar50) &&
                 bVar30;
        bVar31 = (fVar50 < *(float *)(uVar39 + 0xf8) && *(float *)(uVar39 + 0xe8) <= fVar50) &&
                 bVar31;
        bVar32 = (fVar50 < *(float *)(uVar39 + 0xfc) && *(float *)(uVar39 + 0xec) <= fVar50) &&
                 bVar32;
      }
      in_XMM1._0_4_ = (uint)bVar29 * -0x80000000;
      in_XMM1._4_4_ = (uint)bVar30 * -0x80000000;
      in_XMM1._8_4_ = (float)((uint)bVar31 * -0x80000000);
      in_XMM1._12_4_ = (float)((uint)bVar32 * -0x80000000);
      uVar40 = movmskps(uVar40,in_XMM1);
      if (uVar40 == 0) goto LAB_00293f1d;
      uVar40 = uVar40 & 0xff;
      lVar28 = 0;
      if (uVar40 != 0) {
        for (; (uVar40 >> lVar28 & 1) == 0; lVar28 = lVar28 + 1) {
        }
      }
      uVar42 = *(ulong *)(uVar39 + lVar28 * 8);
      uVar40 = uVar40 - 1 & uVar40;
      if (uVar40 != 0) {
        local_a40->ptr = uVar42;
        local_a40 = local_a40 + 1;
        lVar28 = 0;
        if (uVar40 != 0) {
          for (; (uVar40 >> lVar28 & 1) == 0; lVar28 = lVar28 + 1) {
          }
        }
        uVar42 = *(ulong *)(uVar39 + lVar28 * 8);
        uVar40 = uVar40 - 1 & uVar40;
        uVar44 = (ulong)uVar40;
        if (uVar40 != 0) {
          do {
            local_a40->ptr = uVar42;
            local_a40 = local_a40 + 1;
            lVar28 = 0;
            if (uVar44 != 0) {
              for (; (uVar44 >> lVar28 & 1) == 0; lVar28 = lVar28 + 1) {
              }
            }
            uVar42 = *(ulong *)(uVar39 + lVar28 * 8);
            uVar44 = uVar44 & uVar44 - 1;
          } while (uVar44 != 0);
        }
      }
    }
    if (((uint)uVar42 & 0xf) == 8) {
      pGVar24 = (local_a38->super_Precalculations).grid;
      uVar39 = (ulong)*(uint *)(pGVar24 + 0xc);
      fVar177 = *(float *)(ray + k * 4 + 0x70) * (float)(*(int *)(pGVar24 + 8) - 1);
      auVar77 = roundss(in_XMM1,ZEXT416((uint)fVar177),9);
      fVar50 = (float)(*(int *)(pGVar24 + 8) - 1) + -1.0;
      if (fVar50 <= auVar77._0_4_) {
        auVar77._0_4_ = fVar50;
      }
      fVar50 = 0.0;
      if (0.0 <= auVar77._0_4_) {
        fVar50 = auVar77._0_4_;
      }
      fVar177 = fVar177 - fVar50;
      lVar28 = (long)(int)fVar50 * (ulong)*(uint *)(pGVar24 + 0x28) +
               (ulong)*(uint *)(pGVar24 + 0x24);
      uVar40 = *(uint *)(pGVar24 + 0x28) >> 2;
      uVar44 = (ulong)*(uint *)(pGVar24 + 0x14);
      lVar38 = (uVar42 >> 4) * 4 + lVar28;
      lVar28 = (uVar42 >> 4) * 4 + lVar28;
      pGVar46 = pGVar24 + lVar28 + 0x2c;
      pGVar10 = pGVar24 + uVar44 * 4 + lVar38 + 0x2c;
      pGVar11 = pGVar24 + uVar44 * 8 + lVar38 + 0x2c;
      fVar50 = *(float *)(pGVar24 + lVar28 + 0x30);
      pGVar12 = pGVar24 + uVar39 * 4 + lVar38 + 0x2c;
      fVar180 = *(float *)(pGVar12 + 4);
      if (uVar39 == 2) {
        uStack_b30._0_4_ = fVar180;
        _old_t_1 = *(undefined8 *)pGVar12;
        uStack_b30._4_4_ = fVar180;
        fVar51 = *(float *)pGVar10;
        fVar70 = *(float *)(pGVar10 + 4);
        fVar71 = *(float *)(pGVar10 + 8);
        fVar102 = *(float *)(pGVar10 + 0xc);
        fStack_b44 = fVar70;
        local_b48 = fVar70;
        fStack_b40 = fVar70;
        fStack_b3c = fVar70;
        local_b58._0_4_ = *(float *)pGVar11;
        fVar105 = *(float *)(pGVar11 + 4);
        local_b58._4_4_ = *(float *)(pGVar11 + 8);
        fStack_b4c = *(float *)(pGVar11 + 0xc);
        fStack_a70 = fStack_b4c;
        _old_t = *(undefined8 *)(pGVar11 + 8);
        fStack_a6c = fStack_b4c;
        uVar42 = (ulong)(uVar40 << 2);
        fVar73 = *(float *)(pGVar46 + uVar42);
        fVar106 = *(float *)(pGVar46 + uVar42 + 4);
        fVar107 = *(float *)(pGVar46 + uVar42 + 8);
        fVar108 = *(float *)(pGVar46 + uVar42 + 0xc);
        fVar84 = *(float *)(pGVar10 + uVar42);
        fVar110 = *(float *)(pGVar10 + uVar42 + 4);
        fVar116 = *(float *)(pGVar10 + uVar42 + 8);
        fVar120 = *(float *)(pGVar10 + uVar42 + 0xc);
        fVar85 = *(float *)(pGVar11 + uVar42);
        fVar111 = *(float *)(pGVar11 + uVar42 + 4);
        fVar122 = *(float *)(pGVar11 + uVar42 + 8);
        fVar124 = *(float *)(pGVar11 + uVar42 + 0xc);
        fVar137 = fVar124;
        fVar126 = fVar108;
        fVar112 = fVar110;
        fVar140 = fVar120;
        fVar132 = fVar102;
        fVar113 = fVar111;
        fVar130 = fVar105;
        fVar115 = fVar106;
        fStack_b1c = fVar50;
      }
      else {
        uStack_b30._0_4_ = fVar180;
        _old_t_1 = *(undefined8 *)pGVar12;
        uStack_b30._4_4_ = *(float *)(pGVar12 + 8);
        fVar51 = *(float *)pGVar10;
        fVar70 = *(float *)(pGVar10 + 4);
        pGVar43 = pGVar10 + uVar39 * 4;
        fVar71 = *(float *)pGVar43;
        fVar102 = *(float *)(pGVar43 + 8);
        fStack_b44 = fVar70;
        local_b48 = fVar70;
        fStack_b40 = (float)*(undefined4 *)(pGVar10 + 8);
        fStack_b3c = (float)*(undefined4 *)(pGVar10 + 8);
        local_b58._0_4_ = *(float *)pGVar11;
        fVar105 = *(float *)(pGVar11 + 4);
        pGVar1 = pGVar11 + uVar39 * 4;
        local_b58._4_4_ = *(float *)pGVar1;
        fStack_b4c = *(float *)(pGVar1 + 4);
        fStack_a70 = fStack_b4c;
        _old_t = *(undefined8 *)pGVar1;
        fStack_a6c = (float)*(undefined4 *)(pGVar1 + 8);
        uVar42 = (ulong)(uVar40 << 2);
        pGVar1 = pGVar46 + uVar42;
        fVar73 = *(float *)pGVar1;
        fVar106 = *(float *)(pGVar1 + 4);
        pGVar2 = pGVar46 + uVar39 * 4 + uVar42;
        fVar107 = *(float *)pGVar2;
        fVar108 = *(float *)(pGVar2 + 4);
        pGVar3 = pGVar10 + uVar42;
        fVar84 = *(float *)pGVar3;
        fVar110 = *(float *)(pGVar3 + 8);
        pGVar10 = pGVar10 + uVar39 * 4 + uVar42;
        fVar116 = *(float *)pGVar10;
        fVar120 = *(float *)(pGVar10 + 4);
        pGVar4 = pGVar11 + uVar42;
        fVar85 = *(float *)pGVar4;
        fVar111 = *(float *)(pGVar4 + 4);
        pGVar5 = pGVar11 + uVar39 * 4 + uVar42;
        fVar122 = *(float *)pGVar5;
        fVar124 = *(float *)(pGVar5 + 4);
        fVar137 = *(float *)(pGVar5 + 8);
        fVar126 = *(float *)(pGVar2 + 8);
        fVar112 = *(float *)(pGVar3 + 4);
        fVar140 = *(float *)(pGVar10 + 8);
        fVar132 = *(float *)(pGVar43 + 4);
        fVar113 = *(float *)(pGVar4 + 8);
        fVar130 = *(float *)(pGVar11 + 8);
        fVar115 = *(float *)(pGVar1 + 8);
        fStack_b1c = *(float *)(pGVar24 + lVar28 + 0x34);
      }
      local_a20 = (ulong)*(uint *)(pGVar24 + 0x10);
      local_a30 = pGVar24 + uVar44 * 0xc + lVar38 + 0x2c;
      local_7e8 = 1.0 - fVar177;
      fStack_7e4 = local_7e8;
      fStack_7e0 = local_7e8;
      fStack_7dc = local_7e8;
      fVar114 = *(float *)(ray + k * 4);
      fVar134 = *(float *)(ray + k * 4 + 0x10);
      fVar72 = *(float *)(ray + k * 4 + 0x20);
      fVar125 = *(float *)(ray + k * 4 + 0x40);
      fVar151 = (*(float *)pGVar46 * local_7e8 + fVar73 * fVar177) - fVar114;
      fVar155 = (*(float *)pGVar12 * local_7e8 + fVar107 * fVar177) - fVar114;
      fVar156 = (fVar50 * local_7e8 + fVar106 * fVar177) - fVar114;
      fVar157 = (fVar180 * local_7e8 + fVar108 * fVar177) - fVar114;
      fVar87 = (fVar51 * local_7e8 + fVar84 * fVar177) - fVar134;
      fVar95 = (fVar71 * local_7e8 + fVar116 * fVar177) - fVar134;
      fVar96 = (fVar70 * local_7e8 + fVar112 * fVar177) - fVar134;
      fVar97 = (fVar132 * local_7e8 + fVar120 * fVar177) - fVar134;
      fVar73 = ((float)local_b58 * local_7e8 + fVar85 * fVar177) - fVar72;
      fVar84 = (local_b58._4_4_ * local_7e8 + fVar122 * fVar177) - fVar72;
      fVar85 = (fVar105 * local_7e8 + fVar111 * fVar177) - fVar72;
      fVar86 = (fStack_b4c * local_7e8 + fVar124 * fVar177) - fVar72;
      fVar158 = (fVar50 * local_7e8 + fVar106 * fVar177) - fVar114;
      fVar163 = (fVar50 * local_7e8 + fVar106 * fVar177) - fVar114;
      fVar165 = (fStack_b1c * local_7e8 + fVar115 * fVar177) - fVar114;
      fVar167 = (fStack_b1c * local_7e8 + fVar115 * fVar177) - fVar114;
      fVar115 = (local_b48 * local_7e8 + fVar112 * fVar177) - fVar134;
      fVar119 = (fStack_b44 * local_7e8 + fVar112 * fVar177) - fVar134;
      fVar121 = (fStack_b40 * local_7e8 + fVar110 * fVar177) - fVar134;
      fVar123 = (fStack_b3c * local_7e8 + fVar110 * fVar177) - fVar134;
      fVar136 = (fVar105 * local_7e8 + fVar111 * fVar177) - fVar72;
      fVar139 = (fVar105 * local_7e8 + fVar111 * fVar177) - fVar72;
      fVar141 = (fVar130 * local_7e8 + fVar113 * fVar177) - fVar72;
      fVar143 = (fVar130 * local_7e8 + fVar113 * fVar177) - fVar72;
      fVar111 = (old_t_1 * local_7e8 + fVar107 * fVar177) - fVar114;
      fVar112 = (fStack_b34 * local_7e8 + fVar108 * fVar177) - fVar114;
      fVar113 = ((float)uStack_b30 * local_7e8 + fVar108 * fVar177) - fVar114;
      fVar114 = (uStack_b30._4_4_ * local_7e8 + fVar126 * fVar177) - fVar114;
      fVar126 = (fVar71 * local_7e8 + fVar116 * fVar177) - fVar134;
      fVar130 = (fVar132 * local_7e8 + fVar120 * fVar177) - fVar134;
      fVar132 = (fVar132 * local_7e8 + fVar120 * fVar177) - fVar134;
      fVar134 = (fVar102 * local_7e8 + fVar140 * fVar177) - fVar134;
      fVar51 = (old_t * local_7e8 + fVar122 * fVar177) - fVar72;
      fVar70 = (fStack_a74 * local_7e8 + fVar124 * fVar177) - fVar72;
      fVar71 = (fStack_a70 * local_7e8 + fVar124 * fVar177) - fVar72;
      fVar72 = (fStack_a6c * local_7e8 + fVar137 * fVar177) - fVar72;
      fVar108 = fVar111 - fVar151;
      fVar110 = fVar112 - fVar155;
      fStack_a10 = fVar113 - fVar156;
      fStack_a0c = fVar114 - fVar157;
      fVar178 = fVar126 - fVar87;
      fVar185 = fVar130 - fVar95;
      fVar188 = fVar132 - fVar96;
      fVar192 = fVar134 - fVar97;
      fVar169 = fVar51 - fVar73;
      fVar171 = fVar70 - fVar84;
      fVar173 = fVar71 - fVar85;
      fVar175 = fVar72 - fVar86;
      _local_a18 = CONCAT44(fVar110,fVar108);
      fVar50 = *(float *)(ray + k * 4 + 0x50);
      fVar180 = *(float *)(ray + k * 4 + 0x60);
      fVar116 = fVar151 - fVar158;
      fVar120 = fVar155 - fVar163;
      fVar122 = fVar156 - fVar165;
      fVar124 = fVar157 - fVar167;
      fVar145 = (fVar178 * (fVar51 + fVar73) - (fVar126 + fVar87) * fVar169) * fVar125 +
                ((fVar111 + fVar151) * fVar169 - (fVar51 + fVar73) * fVar108) * fVar50 +
                (fVar108 * (fVar126 + fVar87) - (fVar111 + fVar151) * fVar178) * fVar180;
      fVar150 = (fVar185 * (fVar70 + fVar84) - (fVar130 + fVar95) * fVar171) * fVar125 +
                ((fVar112 + fVar155) * fVar171 - (fVar70 + fVar84) * fVar110) * fVar50 +
                (fVar110 * (fVar130 + fVar95) - (fVar112 + fVar155) * fVar185) * fVar180;
      auVar146._0_8_ = CONCAT44(fVar150,fVar145);
      auVar146._8_4_ =
           (fVar188 * (fVar71 + fVar85) - (fVar132 + fVar96) * fVar173) * fVar125 +
           ((fVar113 + fVar156) * fVar173 - (fVar71 + fVar85) * fStack_a10) * fVar50 +
           (fStack_a10 * (fVar132 + fVar96) - (fVar113 + fVar156) * fVar188) * fVar180;
      auVar146._12_4_ =
           (fVar192 * (fVar72 + fVar86) - (fVar134 + fVar97) * fVar175) * fVar125 +
           ((fVar114 + fVar157) * fVar175 - (fVar72 + fVar86) * fStack_a0c) * fVar50 +
           (fStack_a0c * (fVar134 + fVar97) - (fVar114 + fVar157) * fVar192) * fVar180;
      fVar159 = fVar87 - fVar115;
      fVar164 = fVar95 - fVar119;
      fVar166 = fVar96 - fVar121;
      fVar168 = fVar97 - fVar123;
      fVar179 = fVar73 - fVar136;
      fVar186 = fVar84 - fVar139;
      fVar189 = fVar85 - fVar141;
      fVar193 = fVar86 - fVar143;
      auVar152._0_4_ =
           (fVar159 * (fVar73 + fVar136) - (fVar87 + fVar115) * fVar179) * fVar125 +
           ((fVar151 + fVar158) * fVar179 - (fVar73 + fVar136) * fVar116) * fVar50 +
           (fVar116 * (fVar87 + fVar115) - (fVar151 + fVar158) * fVar159) * fVar180;
      auVar152._4_4_ =
           (fVar164 * (fVar84 + fVar139) - (fVar95 + fVar119) * fVar186) * fVar125 +
           ((fVar155 + fVar163) * fVar186 - (fVar84 + fVar139) * fVar120) * fVar50 +
           (fVar120 * (fVar95 + fVar119) - (fVar155 + fVar163) * fVar164) * fVar180;
      auVar152._8_4_ =
           (fVar166 * (fVar85 + fVar141) - (fVar96 + fVar121) * fVar189) * fVar125 +
           ((fVar156 + fVar165) * fVar189 - (fVar85 + fVar141) * fVar122) * fVar50 +
           (fVar122 * (fVar96 + fVar121) - (fVar156 + fVar165) * fVar166) * fVar180;
      auVar152._12_4_ =
           (fVar168 * (fVar86 + fVar143) - (fVar97 + fVar123) * fVar193) * fVar125 +
           ((fVar157 + fVar167) * fVar193 - (fVar86 + fVar143) * fVar124) * fVar50 +
           (fVar124 * (fVar97 + fVar123) - (fVar157 + fVar167) * fVar168) * fVar180;
      fVar137 = fVar158 - fVar111;
      fVar140 = fVar163 - fVar112;
      fVar142 = fVar165 - fVar113;
      fVar144 = fVar167 - fVar114;
      fVar170 = fVar115 - fVar126;
      fVar172 = fVar119 - fVar130;
      fVar174 = fVar121 - fVar132;
      fVar176 = fVar123 - fVar134;
      fVar102 = fVar136 - fVar51;
      fVar105 = fVar139 - fVar70;
      fVar106 = fVar141 - fVar71;
      fVar107 = fVar143 - fVar72;
      auVar78._0_4_ =
           (fVar170 * (fVar51 + fVar136) - (fVar126 + fVar115) * fVar102) * fVar125 +
           ((fVar111 + fVar158) * fVar102 - (fVar51 + fVar136) * fVar137) * fVar50 +
           (fVar137 * (fVar126 + fVar115) - (fVar111 + fVar158) * fVar170) * fVar180;
      auVar78._4_4_ =
           (fVar172 * (fVar70 + fVar139) - (fVar130 + fVar119) * fVar105) * fVar125 +
           ((fVar112 + fVar163) * fVar105 - (fVar70 + fVar139) * fVar140) * fVar50 +
           (fVar140 * (fVar130 + fVar119) - (fVar112 + fVar163) * fVar172) * fVar180;
      auVar78._8_4_ =
           (fVar174 * (fVar71 + fVar141) - (fVar132 + fVar121) * fVar106) * fVar125 +
           ((fVar113 + fVar165) * fVar106 - (fVar71 + fVar141) * fVar142) * fVar50 +
           (fVar142 * (fVar132 + fVar121) - (fVar113 + fVar165) * fVar174) * fVar180;
      auVar78._12_4_ =
           (fVar176 * (fVar72 + fVar143) - (fVar134 + fVar123) * fVar107) * fVar125 +
           ((fVar114 + fVar167) * fVar107 - (fVar72 + fVar143) * fVar144) * fVar50 +
           (fVar144 * (fVar134 + fVar123) - (fVar114 + fVar167) * fVar176) * fVar180;
      auVar89._0_4_ = fVar145 + auVar152._0_4_ + auVar78._0_4_;
      auVar89._4_4_ = fVar150 + auVar152._4_4_ + auVar78._4_4_;
      auVar89._8_4_ = auVar146._8_4_ + auVar152._8_4_ + auVar78._8_4_;
      auVar89._12_4_ = auVar146._12_4_ + auVar152._12_4_ + auVar78._12_4_;
      auVar54._8_4_ = auVar146._8_4_;
      auVar54._0_8_ = auVar146._0_8_;
      auVar54._12_4_ = auVar146._12_4_;
      auVar76 = minps(auVar54,auVar152);
      auVar76 = minps(auVar76,auVar78);
      auVar88 = maxps(auVar146,auVar152);
      auVar88 = maxps(auVar88,auVar78);
      local_7f8 = ABS(auVar89._0_4_);
      fStack_7f4 = ABS(auVar89._4_4_);
      fStack_7f0 = ABS(auVar89._8_4_);
      fStack_7ec = ABS(auVar89._12_4_);
      fVar51 = local_7f8 * 1.1920929e-07;
      fVar70 = fStack_7f4 * 1.1920929e-07;
      auVar147._4_4_ = -(uint)(auVar88._4_4_ <= fVar70);
      auVar147._0_4_ = -(uint)(auVar88._0_4_ <= fVar51);
      auVar147._8_4_ = -(uint)(auVar88._8_4_ <= fStack_7f0 * 1.1920929e-07);
      auVar147._12_4_ = -(uint)(auVar88._12_4_ <= fStack_7ec * 1.1920929e-07);
      in_XMM1._0_8_ = CONCAT44(fVar70,fVar51) ^ 0x8000000080000000;
      in_XMM1._8_4_ = -(fStack_7f0 * 1.1920929e-07);
      in_XMM1._12_4_ = -(fStack_7ec * 1.1920929e-07);
      auVar55._4_4_ = -(uint)(-fVar70 <= auVar76._4_4_);
      auVar55._0_4_ = -(uint)(-fVar51 <= auVar76._0_4_);
      auVar55._8_4_ = -(uint)(in_XMM1._8_4_ <= auVar76._8_4_);
      auVar55._12_4_ = -(uint)(in_XMM1._12_4_ <= auVar76._12_4_);
      auVar147 = auVar147 | auVar55;
      iVar41 = movmskps((int)local_a30,auVar147);
      local_a00 = local_a20;
      if (iVar41 == 0) {
LAB_00293328:
        auVar100._4_4_ = fVar177;
        auVar100._0_4_ = fVar177;
        auVar100._8_4_ = fVar177;
        auVar100._12_4_ = fVar177;
      }
      else {
        auVar161._0_4_ = fVar178 * fVar179 - fVar159 * fVar169;
        auVar161._4_4_ = fVar185 * fVar186 - fVar164 * fVar171;
        auVar161._8_4_ = fVar188 * fVar189 - fVar166 * fVar173;
        auVar161._12_4_ = fVar192 * fVar193 - fVar168 * fVar175;
        auVar181._0_4_ = fVar159 * fVar102 - fVar170 * fVar179;
        auVar181._4_4_ = fVar164 * fVar105 - fVar172 * fVar186;
        auVar181._8_4_ = fVar166 * fVar106 - fVar174 * fVar189;
        auVar181._12_4_ = fVar168 * fVar107 - fVar176 * fVar193;
        uVar40 = (uint)DAT_01f7b6c0;
        uVar131 = DAT_01f7b6c0._4_4_;
        uVar133 = DAT_01f7b6c0._8_4_;
        uVar135 = DAT_01f7b6c0._12_4_;
        auVar56._4_4_ =
             -(uint)((float)((uint)(fVar164 * fVar171) & uVar131) <
                    (float)((uint)(fVar172 * fVar186) & uVar131));
        auVar56._0_4_ =
             -(uint)((float)((uint)(fVar159 * fVar169) & uVar40) <
                    (float)((uint)(fVar170 * fVar179) & uVar40));
        auVar56._8_4_ =
             -(uint)((float)((uint)(fVar166 * fVar173) & uVar133) <
                    (float)((uint)(fVar174 * fVar189) & uVar133));
        auVar56._12_4_ =
             -(uint)((float)((uint)(fVar168 * fVar175) & uVar135) <
                    (float)((uint)(fVar176 * fVar193) & uVar135));
        local_8b8 = blendvps(auVar181,auVar161,auVar56);
        auVar153._0_4_ = fVar169 * fVar116 - fVar108 * fVar179;
        auVar153._4_4_ = fVar171 * fVar120 - fVar110 * fVar186;
        auVar153._8_4_ = fVar173 * fVar122 - fStack_a10 * fVar189;
        auVar153._12_4_ = fVar175 * fVar124 - fStack_a0c * fVar193;
        auVar138._0_4_ = fVar137 * fVar179 - fVar116 * fVar102;
        auVar138._4_4_ = fVar140 * fVar186 - fVar120 * fVar105;
        auVar138._8_4_ = fVar142 * fVar189 - fVar122 * fVar106;
        auVar138._12_4_ = fVar144 * fVar193 - fVar124 * fVar107;
        auVar57._4_4_ =
             -(uint)((float)((uint)(fVar110 * fVar186) & uVar131) <
                    (float)((uint)(fVar120 * fVar105) & uVar131));
        auVar57._0_4_ =
             -(uint)((float)((uint)(fVar108 * fVar179) & uVar40) <
                    (float)((uint)(fVar116 * fVar102) & uVar40));
        auVar57._8_4_ =
             -(uint)((float)((uint)(fStack_a10 * fVar189) & uVar133) <
                    (float)((uint)(fVar122 * fVar106) & uVar133));
        auVar57._12_4_ =
             -(uint)((float)((uint)(fStack_a0c * fVar193) & uVar135) <
                    (float)((uint)(fVar124 * fVar107) & uVar135));
        local_8a8 = blendvps(auVar138,auVar153,auVar57);
        auVar117._0_4_ = fVar108 * fVar159 - fVar116 * fVar178;
        auVar117._4_4_ = fVar110 * fVar164 - fVar120 * fVar185;
        auVar117._8_4_ = fStack_a10 * fVar166 - fVar122 * fVar188;
        auVar117._12_4_ = fStack_a0c * fVar168 - fVar124 * fVar192;
        auVar109._0_4_ = fVar116 * fVar170 - fVar137 * fVar159;
        auVar109._4_4_ = fVar120 * fVar172 - fVar140 * fVar164;
        auVar109._8_4_ = fVar122 * fVar174 - fVar142 * fVar166;
        auVar109._12_4_ = fVar124 * fVar176 - fVar144 * fVar168;
        auVar58._4_4_ =
             -(uint)((float)((uint)(fVar120 * fVar185) & uVar131) <
                    (float)((uint)(fVar140 * fVar164) & uVar131));
        auVar58._0_4_ =
             -(uint)((float)((uint)(fVar116 * fVar178) & uVar40) <
                    (float)((uint)(fVar137 * fVar159) & uVar40));
        auVar58._8_4_ =
             -(uint)((float)((uint)(fVar122 * fVar188) & uVar133) <
                    (float)((uint)(fVar142 * fVar166) & uVar133));
        auVar58._12_4_ =
             -(uint)((float)((uint)(fVar124 * fVar192) & uVar135) <
                    (float)((uint)(fVar144 * fVar168) & uVar135));
        local_898 = blendvps(auVar109,auVar117,auVar58);
        fVar106 = fVar125 * local_8b8._0_4_ + fVar50 * local_8a8._0_4_ + fVar180 * local_898._0_4_;
        fVar107 = fVar125 * local_8b8._4_4_ + fVar50 * local_8a8._4_4_ + fVar180 * local_898._4_4_;
        fVar108 = fVar125 * local_8b8._8_4_ + fVar50 * local_8a8._8_4_ + fVar180 * local_898._8_4_;
        fVar110 = fVar125 * local_8b8._12_4_ +
                  fVar50 * local_8a8._12_4_ + fVar180 * local_898._12_4_;
        fVar106 = fVar106 + fVar106;
        fVar107 = fVar107 + fVar107;
        fVar108 = fVar108 + fVar108;
        fVar110 = fVar110 + fVar110;
        auVar79._0_4_ = fVar73 * local_898._0_4_;
        auVar79._4_4_ = fVar84 * local_898._4_4_;
        auVar79._8_4_ = fVar85 * local_898._8_4_;
        auVar79._12_4_ = fVar86 * local_898._12_4_;
        fVar71 = fVar151 * local_8b8._0_4_ + fVar87 * local_8a8._0_4_ + auVar79._0_4_;
        fVar102 = fVar155 * local_8b8._4_4_ + fVar95 * local_8a8._4_4_ + auVar79._4_4_;
        fVar105 = fVar156 * local_8b8._8_4_ + fVar96 * local_8a8._8_4_ + auVar79._8_4_;
        fVar73 = fVar157 * local_8b8._12_4_ + fVar97 * local_8a8._12_4_ + auVar79._12_4_;
        auVar33._4_4_ = fVar107;
        auVar33._0_4_ = fVar106;
        auVar33._8_4_ = fVar108;
        auVar33._12_4_ = fVar110;
        auVar76 = rcpps(auVar79,auVar33);
        fVar50 = auVar76._0_4_;
        fVar180 = auVar76._4_4_;
        fVar51 = auVar76._8_4_;
        fVar70 = auVar76._12_4_;
        local_8c8._0_4_ = ((1.0 - fVar106 * fVar50) * fVar50 + fVar50) * (fVar71 + fVar71);
        local_8c8._4_4_ = ((1.0 - fVar107 * fVar180) * fVar180 + fVar180) * (fVar102 + fVar102);
        local_8c8._8_4_ = ((1.0 - fVar108 * fVar51) * fVar51 + fVar51) * (fVar105 + fVar105);
        local_8c8._12_4_ = ((1.0 - fVar110 * fVar70) * fVar70 + fVar70) * (fVar73 + fVar73);
        fVar50 = *(float *)(ray + k * 4 + 0x80);
        fVar180 = *(float *)(ray + k * 4 + 0x30);
        in_XMM1._0_4_ =
             -(uint)(local_8c8._0_4_ <= fVar50 && fVar180 <= local_8c8._0_4_) & auVar147._0_4_;
        in_XMM1._4_4_ =
             -(uint)(local_8c8._4_4_ <= fVar50 && fVar180 <= local_8c8._4_4_) & auVar147._4_4_;
        in_XMM1._8_4_ =
             (float)(-(uint)(local_8c8._8_4_ <= fVar50 && fVar180 <= local_8c8._8_4_) &
                    auVar147._8_4_);
        in_XMM1._12_4_ =
             (float)(-(uint)(local_8c8._12_4_ <= fVar50 && fVar180 <= local_8c8._12_4_) &
                    auVar147._12_4_);
        iVar41 = movmskps(iVar41,in_XMM1);
        if (iVar41 == 0) goto LAB_00293328;
        in_XMM1._0_4_ = in_XMM1._0_4_ & -(uint)(fVar106 != 0.0);
        in_XMM1._4_4_ = in_XMM1._4_4_ & -(uint)(fVar107 != 0.0);
        in_XMM1._8_4_ = (float)((uint)in_XMM1._8_4_ & -(uint)(fVar108 != 0.0));
        in_XMM1._12_4_ = (float)((uint)in_XMM1._12_4_ & -(uint)(fVar110 != 0.0));
        uVar40 = movmskps(*(uint *)(pGVar24 + 0x10),in_XMM1);
        if (uVar40 == 0) goto LAB_00293328;
        uVar131 = *(uint *)(pGVar24 + 0x18);
        uStack_b30._0_4_ = *(float *)(pGVar24 + 0x1c);
        pGVar25 = (context->scene->geometries).items[uVar131].ptr;
        if ((pGVar25->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) goto LAB_00293328;
        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
           (pGVar25->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_002940f7;
        auVar76 = *(undefined1 (*) [16])local_a30;
        auVar74 = auVar76._0_12_;
        auVar88 = *(undefined1 (*) [16])(local_a30 + uVar39 * 4);
        auVar52 = auVar88._0_12_;
        if (uVar39 == 2) {
          auVar74._0_8_ = auVar76._0_8_;
          auVar74._8_4_ = auVar76._4_4_;
          auVar52._0_8_ = auVar88._0_8_;
          auVar52._8_4_ = auVar88._4_4_;
        }
        auVar76 = rcpps(auVar89,auVar89);
        fVar180 = auVar76._0_4_;
        fVar51 = auVar76._4_4_;
        fVar70 = auVar76._8_4_;
        fVar71 = auVar76._12_4_;
        fVar180 = (float)(-(uint)(1e-18 <= local_7f8) &
                         (uint)(((float)DAT_01f7ba10 - auVar89._0_4_ * fVar180) * fVar180 + fVar180)
                         );
        fVar51 = (float)(-(uint)(1e-18 <= fStack_7f4) &
                        (uint)((DAT_01f7ba10._4_4_ - auVar89._4_4_ * fVar51) * fVar51 + fVar51));
        fVar70 = (float)(-(uint)(1e-18 <= fStack_7f0) &
                        (uint)((DAT_01f7ba10._8_4_ - auVar89._8_4_ * fVar70) * fVar70 + fVar70));
        fVar71 = (float)(-(uint)(1e-18 <= fStack_7ec) &
                        (uint)((DAT_01f7ba10._12_4_ - auVar89._12_4_ * fVar71) * fVar71 + fVar71));
        auVar182._0_4_ = fVar145 * fVar180;
        auVar182._4_4_ = fVar150 * fVar51;
        auVar182._8_4_ = auVar146._8_4_ * fVar70;
        auVar182._12_4_ = auVar146._12_4_ * fVar71;
        auVar183 = minps(auVar182,_DAT_01f7ba10);
        auVar127._0_4_ = auVar152._0_4_ * fVar180;
        auVar127._4_4_ = auVar152._4_4_ * fVar51;
        auVar127._8_4_ = auVar152._8_4_ * fVar70;
        auVar127._12_4_ = auVar152._12_4_ * fVar71;
        auVar128 = minps(auVar127,_DAT_01f7ba10);
        auVar80._4_4_ = auVar74._4_4_;
        auVar91._0_8_ = auVar74._0_8_;
        auVar80._8_4_ = auVar74._8_4_;
        auVar91._8_4_ = auVar80._4_4_;
        uVar135 = auVar52._4_4_;
        auVar91._12_4_ = uVar135;
        uVar133 = auVar52._0_4_;
        auVar90._8_8_ = auVar91._8_8_;
        auVar90._0_4_ = auVar74._0_4_;
        auVar90._4_4_ = uVar133;
        auVar80._0_4_ = auVar80._4_4_;
        auVar80._12_4_ = auVar80._8_4_;
        auVar59._0_8_ = auVar52._0_8_;
        auVar59._8_4_ = uVar135;
        auVar59._12_4_ = auVar52._8_4_;
        auVar99 = pblendw(auVar90,ZEXT816(0),0xaa);
        auVar88 = pblendw(auVar80,_DAT_01f7aa10,0xaa);
        auVar76 = pblendw(auVar59,_DAT_01f7aa10,0xaa);
        fVar107 = auVar183._0_4_;
        fVar108 = auVar183._4_4_;
        fVar84 = auVar183._8_4_;
        fVar110 = auVar183._12_4_;
        fVar102 = auVar128._0_4_;
        fVar105 = auVar128._4_4_;
        fVar73 = auVar128._8_4_;
        fVar106 = auVar128._12_4_;
        fVar180 = (1.0 - fVar107) - fVar102;
        fVar51 = (1.0 - fVar108) - fVar105;
        fVar70 = (1.0 - fVar84) - fVar73;
        fVar71 = (1.0 - fVar110) - fVar106;
        local_8e8[0] = (float)auVar99._0_4_ * 0.00012207031 * fVar180 +
                       (float)auVar76._0_4_ * 0.00012207031 * fVar102 +
                       (float)auVar88._0_4_ * 0.00012207031 * fVar107;
        local_8e8[1] = (float)auVar99._4_4_ * 0.00012207031 * fVar51 +
                       (float)auVar76._4_4_ * 0.00012207031 * fVar105 +
                       (float)auVar88._4_4_ * 0.00012207031 * fVar108;
        local_8e8[2] = (float)auVar99._8_4_ * 0.00012207031 * fVar70 +
                       (float)auVar76._8_4_ * 0.00012207031 * fVar73 +
                       (float)auVar88._8_4_ * 0.00012207031 * fVar84;
        local_8e8[3] = (float)auVar99._12_4_ * 0.00012207031 * fVar71 +
                       (float)auVar76._12_4_ * 0.00012207031 * fVar106 +
                       (float)auVar88._12_4_ * 0.00012207031 * fVar110;
        local_8d8[0] = fVar180 * (float)(auVar90._0_4_ >> 0x10) * 0.00012207031 +
                       (float)(uVar133 >> 0x10) * 0.00012207031 * fVar102 +
                       (float)(auVar80._4_4_ >> 0x10) * 0.00012207031 * fVar107;
        local_8d8[1] = fVar51 * (float)(uVar133 >> 0x10) * 0.00012207031 +
                       (float)(uVar135 >> 0x10) * 0.00012207031 * fVar105 +
                       (float)(auVar80._4_4_ >> 0x10) * 0.00012207031 * fVar108;
        local_8d8[2] = fVar70 * (float)(auVar80._4_4_ >> 0x10) * 0.00012207031 +
                       (float)(uVar135 >> 0x10) * 0.00012207031 * fVar73 +
                       (float)(auVar80._8_4_ >> 0x10) * 0.00012207031 * fVar84;
        local_8d8[3] = fVar71 * (float)(uVar135 >> 0x10) * 0.00012207031 +
                       (float)(auVar52._8_4_ >> 0x10) * 0.00012207031 * fVar106 +
                       (float)(auVar80._8_4_ >> 0x10) * 0.00012207031 * fVar110;
        uVar44 = (ulong)(uVar40 & 0xff);
        uVar42 = 0;
        if (uVar44 != 0) {
          for (; ((uVar40 & 0xff) >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
          }
        }
        _old_t_1 = CONCAT44((float)uStack_b30,(float)uStack_b30);
        uStack_b30._4_4_ = (float)uStack_b30;
        auVar74 = *local_a08;
        uStack_a5c = (undefined4)((ulong)*(undefined8 *)(*local_a08 + 8) >> 0x20);
        auVar100._4_4_ = fVar177;
        auVar100._0_4_ = fVar177;
        auVar100._8_4_ = fVar177;
        auVar100._12_4_ = fVar177;
        local_a28 = uVar39;
        do {
          local_858 = local_8e8[uVar42];
          fVar180 = local_8d8[uVar42];
          *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_8c8 + uVar42 * 4);
          args.context = context->user;
          local_848._4_4_ = fVar180;
          local_848._0_4_ = fVar180;
          local_848._8_4_ = fVar180;
          local_848._12_4_ = fVar180;
          local_888 = *(undefined4 *)(local_8b8 + uVar42 * 4);
          local_878._4_4_ = *(undefined4 *)(local_8a8 + uVar42 * 4);
          uVar21 = *(undefined4 *)(local_898 + uVar42 * 4);
          local_868._4_4_ = uVar21;
          local_868._0_4_ = uVar21;
          local_868._8_4_ = uVar21;
          local_868._12_4_ = uVar21;
          uStack_884 = local_888;
          uStack_880 = local_888;
          uStack_87c = local_888;
          local_878._0_4_ = local_878._4_4_;
          local_878._8_4_ = local_878._4_4_;
          local_878._12_4_ = local_878._4_4_;
          fStack_854 = local_858;
          fStack_850 = local_858;
          fStack_84c = local_858;
          local_838 = _old_t_1;
          uStack_830 = uStack_b30;
          local_828 = CONCAT44(uVar131,uVar131);
          uStack_820 = CONCAT44(uVar131,uVar131);
          local_818 = (args.context)->instID[0];
          uStack_814 = local_818;
          uStack_810 = local_818;
          uStack_80c = local_818;
          local_808 = (args.context)->instPrimID[0];
          uStack_804 = local_808;
          uStack_800 = local_808;
          uStack_7fc = local_808;
          local_a58._12_4_ = uStack_a5c;
          local_a58._0_12_ = auVar74;
          args.valid = (int *)local_a58;
          args.geometryUserPtr = pGVar25->userPtr;
          args.hit = (RTCHitN *)&local_888;
          args.N = 4;
          args.ray = (RTCRayN *)ray;
          if (pGVar25->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            (*pGVar25->occlusionFilterN)(&args);
          }
          if (local_a58 == (undefined1  [16])0x0) {
            auVar61._8_4_ = 0xffffffff;
            auVar61._0_8_ = 0xffffffffffffffff;
            auVar61._12_4_ = 0xffffffff;
            in_XMM1 = auVar61 ^ _DAT_01f7ae20;
          }
          else {
            p_Var26 = context->args->filter;
            if ((p_Var26 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar25->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var26)(&args);
            }
            auVar60._0_4_ = -(uint)(local_a58._0_4_ == 0);
            auVar60._4_4_ = -(uint)(local_a58._4_4_ == 0);
            auVar60._8_4_ = -(uint)(local_a58._8_4_ == 0);
            auVar60._12_4_ = -(uint)(local_a58._12_4_ == 0);
            in_XMM1 = auVar60 ^ _DAT_01f7ae20;
            auVar76 = blendvps(_DAT_01f7aa00,*(undefined1 (*) [16])(args.ray + 0x80),auVar60);
            *(undefined1 (*) [16])(args.ray + 0x80) = auVar76;
          }
          if ((_DAT_01f7bb20 & in_XMM1) != (undefined1  [16])0x0) goto LAB_002940f7;
          *(float *)(ray + k * 4 + 0x80) = fVar50;
          uVar44 = uVar44 ^ 1L << (uVar42 & 0x3f);
          uVar42 = 0;
          if (uVar44 != 0) {
            for (; (uVar44 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
            }
          }
        } while (uVar44 != 0);
      }
      if (2 < (uint)local_a00) {
        lVar38 = uVar39 * 4 + lVar38;
        pGVar43 = pGVar24 + lVar38 + 0x2c;
        pGVar46 = (local_a38->super_Precalculations).grid;
        uVar42 = (ulong)*(uint *)(pGVar46 + 0x14);
        pGVar10 = pGVar43 + uVar42 * 4;
        pGVar11 = pGVar43 + uVar42 * 8;
        fVar50 = *(float *)(pGVar24 + lVar38 + 0x30);
        pGVar12 = pGVar43 + uVar39 * 4;
        fVar177 = *(float *)(pGVar12 + 4);
        if (uVar39 == 2) {
          fVar180 = *(float *)pGVar10;
          fVar51 = *(float *)(pGVar10 + 4);
          fVar70 = *(float *)(pGVar10 + 8);
          fVar71 = *(float *)(pGVar10 + 0xc);
          fVar102 = *(float *)pGVar11;
          fVar105 = *(float *)(pGVar11 + 4);
          fVar73 = *(float *)(pGVar11 + 8);
          fVar106 = *(float *)(pGVar11 + 0xc);
          uVar44 = (ulong)((*(uint *)(pGVar46 + 0x28) >> 2) << 2);
          fVar107 = *(float *)(pGVar43 + uVar44);
          fVar108 = *(float *)(pGVar43 + uVar44 + 4);
          fVar84 = *(float *)(pGVar43 + uVar44 + 8);
          fVar110 = *(float *)(pGVar43 + uVar44 + 0xc);
          fVar116 = *(float *)(pGVar10 + uVar44);
          fVar120 = *(float *)(pGVar10 + uVar44 + 4);
          fVar122 = *(float *)(pGVar10 + uVar44 + 8);
          fVar124 = *(float *)(pGVar10 + uVar44 + 0xc);
          fVar85 = *(float *)(pGVar11 + uVar44);
          fVar111 = *(float *)(pGVar11 + uVar44 + 4);
          fVar137 = *(float *)(pGVar11 + uVar44 + 8);
          fVar126 = *(float *)(pGVar11 + uVar44 + 0xc);
          fVar112 = fVar50;
          fVar140 = fVar108;
          fVar132 = fVar110;
          fVar113 = fVar124;
          fVar130 = fVar111;
          fVar115 = fVar126;
          fVar114 = fVar51;
          fVar134 = fVar120;
          fVar72 = fVar105;
          fStack_b4c = fVar71;
          fStack_b1c = fVar106;
          fStack_b0c = fVar177;
        }
        else {
          fVar180 = *(float *)pGVar10;
          fVar51 = *(float *)(pGVar10 + 4);
          pGVar1 = pGVar10 + uVar39 * 4;
          fVar70 = *(float *)pGVar1;
          fVar71 = *(float *)(pGVar1 + 4);
          fVar102 = *(float *)pGVar11;
          fVar105 = *(float *)(pGVar11 + 4);
          pGVar2 = pGVar11 + uVar39 * 4;
          fVar73 = *(float *)pGVar2;
          fVar106 = *(float *)(pGVar2 + 4);
          uVar44 = (ulong)((*(uint *)(pGVar46 + 0x28) >> 2) << 2);
          pGVar3 = pGVar43 + uVar44;
          fVar107 = *(float *)pGVar3;
          fVar108 = *(float *)(pGVar3 + 8);
          pGVar4 = pGVar43 + uVar39 * 4 + uVar44;
          fVar84 = *(float *)pGVar4;
          fVar110 = *(float *)(pGVar4 + 4);
          pGVar5 = pGVar10 + uVar44;
          fVar116 = *(float *)pGVar5;
          fVar120 = *(float *)(pGVar5 + 4);
          pGVar6 = pGVar10 + uVar39 * 4 + uVar44;
          fVar122 = *(float *)pGVar6;
          fVar124 = *(float *)(pGVar6 + 4);
          pGVar7 = pGVar11 + uVar44;
          fVar85 = *(float *)pGVar7;
          fVar111 = *(float *)(pGVar7 + 4);
          pGVar8 = pGVar11 + uVar39 * 4 + uVar44;
          fVar137 = *(float *)pGVar8;
          fVar126 = *(float *)(pGVar8 + 4);
          fVar112 = *(float *)(pGVar24 + lVar38 + 0x34);
          fVar140 = *(float *)(pGVar3 + 4);
          fVar132 = *(float *)(pGVar4 + 8);
          fVar113 = *(float *)(pGVar6 + 8);
          fVar130 = *(float *)(pGVar7 + 8);
          fVar115 = *(float *)(pGVar8 + 8);
          fVar114 = *(float *)(pGVar10 + 8);
          fVar134 = *(float *)(pGVar5 + 8);
          fVar72 = *(float *)(pGVar11 + 8);
          fStack_b4c = *(float *)(pGVar1 + 8);
          fStack_b1c = *(float *)(pGVar2 + 8);
          fStack_b0c = *(float *)(pGVar12 + 8);
        }
        local_a30 = pGVar43 + uVar42 * 0xc;
        fVar136 = auVar100._0_4_;
        fVar139 = auVar100._4_4_;
        fVar141 = auVar100._8_4_;
        fVar142 = auVar100._12_4_;
        local_a20 = local_a00;
        fVar125 = *(float *)(ray + k * 4);
        fVar86 = *(float *)(ray + k * 4 + 0x10);
        fVar87 = *(float *)(ray + k * 4 + 0x20);
        fVar95 = *(float *)(ray + k * 4 + 0x40);
        fVar96 = *(float *)(ray + k * 4 + 0x50);
        fVar97 = (*(float *)pGVar43 * local_7e8 + fVar107 * fVar136) - fVar125;
        fVar119 = (*(float *)pGVar12 * fStack_7e4 + fVar84 * fVar139) - fVar125;
        fVar121 = (fVar50 * fStack_7e0 + fVar140 * fVar141) - fVar125;
        fVar123 = (fVar177 * fStack_7dc + fVar110 * fVar142) - fVar125;
        fVar189 = (fVar180 * local_7e8 + fVar116 * fVar136) - fVar86;
        fVar193 = (fVar70 * fStack_7e4 + fVar122 * fVar139) - fVar86;
        fVar190 = (fVar51 * fStack_7e0 + fVar120 * fVar141) - fVar86;
        fVar194 = (fVar71 * fStack_7dc + fVar124 * fVar142) - fVar86;
        fVar102 = (fVar102 * local_7e8 + fVar85 * fVar136) - fVar87;
        fVar107 = (fVar73 * fStack_7e4 + fVar137 * fVar139) - fVar87;
        fVar116 = (fVar105 * fStack_7e0 + fVar111 * fVar141) - fVar87;
        fVar85 = (fVar106 * fStack_7dc + fVar126 * fVar142) - fVar87;
        fVar143 = (fVar50 * local_7e8 + fVar140 * fVar136) - fVar125;
        fVar144 = (fVar50 * fStack_7e4 + fVar140 * fVar139) - fVar125;
        fVar145 = (fVar112 * fStack_7e0 + fVar108 * fVar141) - fVar125;
        fVar150 = (fVar112 * fStack_7dc + fVar108 * fVar142) - fVar125;
        fVar166 = (fVar51 * local_7e8 + fVar120 * fVar136) - fVar86;
        fVar168 = (fVar51 * fStack_7e4 + fVar120 * fVar139) - fVar86;
        fVar170 = (fVar114 * fStack_7e0 + fVar134 * fVar141) - fVar86;
        fVar172 = (fVar114 * fStack_7dc + fVar134 * fVar142) - fVar86;
        fVar151 = (fVar105 * local_7e8 + fVar111 * fVar136) - fVar87;
        fVar155 = (fVar105 * fStack_7e4 + fVar111 * fVar139) - fVar87;
        fVar156 = (fVar72 * fStack_7e0 + fVar130 * fVar141) - fVar87;
        fVar72 = (fVar72 * fStack_7dc + fVar130 * fVar142) - fVar87;
        fVar130 = (*(float *)pGVar12 * local_7e8 + fVar84 * fVar136) - fVar125;
        fVar114 = (fVar177 * fStack_7e4 + fVar110 * fVar139) - fVar125;
        fVar134 = (fVar177 * fStack_7e0 + fVar110 * fVar141) - fVar125;
        fVar125 = (fStack_b0c * fStack_7dc + fVar132 * fVar142) - fVar125;
        fVar177 = (fVar70 * local_7e8 + fVar122 * fVar136) - fVar86;
        fVar180 = (fVar71 * fStack_7e4 + fVar124 * fVar139) - fVar86;
        fVar51 = (fVar71 * fStack_7e0 + fVar124 * fVar141) - fVar86;
        fVar86 = (fStack_b4c * fStack_7dc + fVar113 * fVar142) - fVar86;
        fVar70 = (fVar73 * local_7e8 + fVar137 * fVar136) - fVar87;
        fVar164 = (fVar106 * fStack_7e4 + fVar126 * fVar139) - fVar87;
        fVar165 = (fVar106 * fStack_7e0 + fVar126 * fVar141) - fVar87;
        fVar87 = (fStack_b1c * fStack_7dc + fVar115 * fVar142) - fVar87;
        fVar126 = fVar130 - fVar97;
        fVar112 = fVar114 - fVar119;
        fVar140 = fVar134 - fVar121;
        fVar132 = fVar125 - fVar123;
        fVar141 = fVar177 - fVar189;
        fVar157 = fVar180 - fVar193;
        fStack_a10 = fVar51 - fVar190;
        fStack_a0c = fVar86 - fVar194;
        fVar174 = fVar70 - fVar102;
        fVar176 = fVar164 - fVar107;
        fVar179 = fVar165 - fVar116;
        fVar186 = fVar87 - fVar85;
        fVar50 = *(float *)(ray + k * 4 + 0x60);
        _local_a18 = CONCAT44(fVar157,fVar141);
        fVar108 = fVar97 - fVar143;
        fVar110 = fVar119 - fVar144;
        fVar122 = fVar121 - fVar145;
        fVar111 = fVar123 - fVar150;
        fVar167 = fVar189 - fVar166;
        fVar169 = fVar193 - fVar168;
        fVar171 = fVar190 - fVar170;
        fVar173 = fVar194 - fVar172;
        fVar71 = (fVar141 * (fVar70 + fVar102) - (fVar177 + fVar189) * fVar174) * fVar95 +
                 ((fVar130 + fVar97) * fVar174 - (fVar70 + fVar102) * fVar126) * fVar96 +
                 (fVar126 * (fVar177 + fVar189) - (fVar130 + fVar97) * fVar141) * fVar50;
        fVar105 = (fVar157 * (fVar164 + fVar107) - (fVar180 + fVar193) * fVar176) * fVar95 +
                  ((fVar114 + fVar119) * fVar176 - (fVar164 + fVar107) * fVar112) * fVar96 +
                  (fVar112 * (fVar180 + fVar193) - (fVar114 + fVar119) * fVar157) * fVar50;
        fVar73 = (fStack_a10 * (fVar165 + fVar116) - (fVar51 + fVar190) * fVar179) * fVar95 +
                 ((fVar134 + fVar121) * fVar179 - (fVar165 + fVar116) * fVar140) * fVar96 +
                 (fVar140 * (fVar51 + fVar190) - (fVar134 + fVar121) * fStack_a10) * fVar50;
        fVar106 = (fStack_a0c * (fVar87 + fVar85) - (fVar86 + fVar194) * fVar186) * fVar95 +
                  ((fVar125 + fVar123) * fVar186 - (fVar87 + fVar85) * fVar132) * fVar96 +
                  (fVar132 * (fVar86 + fVar194) - (fVar125 + fVar123) * fStack_a0c) * fVar50;
        fVar142 = fVar102 - fVar151;
        fVar158 = fVar107 - fVar155;
        fVar159 = fVar116 - fVar156;
        fVar163 = fVar85 - fVar72;
        fVar175 = (fVar167 * (fVar102 + fVar151) - (fVar189 + fVar166) * fVar142) * fVar95 +
                  ((fVar97 + fVar143) * fVar142 - (fVar102 + fVar151) * fVar108) * fVar96 +
                  (fVar108 * (fVar189 + fVar166) - (fVar97 + fVar143) * fVar167) * fVar50;
        fVar178 = (fVar169 * (fVar107 + fVar155) - (fVar193 + fVar168) * fVar158) * fVar95 +
                  ((fVar119 + fVar144) * fVar158 - (fVar107 + fVar155) * fVar110) * fVar96 +
                  (fVar110 * (fVar193 + fVar168) - (fVar119 + fVar144) * fVar169) * fVar50;
        fVar185 = (fVar171 * (fVar116 + fVar156) - (fVar190 + fVar170) * fVar159) * fVar95 +
                  ((fVar121 + fVar145) * fVar159 - (fVar116 + fVar156) * fVar122) * fVar96 +
                  (fVar122 * (fVar190 + fVar170) - (fVar121 + fVar145) * fVar171) * fVar50;
        fVar188 = (fVar173 * (fVar85 + fVar72) - (fVar194 + fVar172) * fVar163) * fVar95 +
                  ((fVar123 + fVar150) * fVar163 - (fVar85 + fVar72) * fVar111) * fVar96 +
                  (fVar111 * (fVar194 + fVar172) - (fVar123 + fVar150) * fVar173) * fVar50;
        fVar84 = fVar143 - fVar130;
        fVar120 = fVar144 - fVar114;
        fVar124 = fVar145 - fVar134;
        fVar137 = fVar150 - fVar125;
        fVar113 = fVar166 - fVar177;
        fVar115 = fVar168 - fVar180;
        fVar136 = fVar170 - fVar51;
        fVar139 = fVar172 - fVar86;
        fVar192 = fVar151 - fVar70;
        fVar187 = fVar155 - fVar164;
        fVar191 = fVar156 - fVar165;
        fVar195 = fVar72 - fVar87;
        auVar81._0_4_ =
             (fVar113 * (fVar70 + fVar151) - (fVar177 + fVar166) * fVar192) * fVar95 +
             ((fVar130 + fVar143) * fVar192 - (fVar70 + fVar151) * fVar84) * fVar96 +
             (fVar84 * (fVar177 + fVar166) - (fVar130 + fVar143) * fVar113) * fVar50;
        auVar81._4_4_ =
             (fVar115 * (fVar164 + fVar155) - (fVar180 + fVar168) * fVar187) * fVar95 +
             ((fVar114 + fVar144) * fVar187 - (fVar164 + fVar155) * fVar120) * fVar96 +
             (fVar120 * (fVar180 + fVar168) - (fVar114 + fVar144) * fVar115) * fVar50;
        auVar81._8_4_ =
             (fVar136 * (fVar165 + fVar156) - (fVar51 + fVar170) * fVar191) * fVar95 +
             ((fVar134 + fVar145) * fVar191 - (fVar165 + fVar156) * fVar124) * fVar96 +
             (fVar124 * (fVar51 + fVar170) - (fVar134 + fVar145) * fVar136) * fVar50;
        auVar81._12_4_ =
             (fVar139 * (fVar87 + fVar72) - (fVar86 + fVar172) * fVar195) * fVar95 +
             ((fVar125 + fVar150) * fVar195 - (fVar87 + fVar72) * fVar137) * fVar96 +
             (fVar137 * (fVar86 + fVar172) - (fVar125 + fVar150) * fVar139) * fVar50;
        auVar92._0_4_ = fVar71 + fVar175 + auVar81._0_4_;
        auVar92._4_4_ = fVar105 + fVar178 + auVar81._4_4_;
        auVar92._8_4_ = fVar73 + fVar185 + auVar81._8_4_;
        auVar92._12_4_ = fVar106 + fVar188 + auVar81._12_4_;
        auVar62._8_4_ = fVar73;
        auVar62._0_8_ = CONCAT44(fVar105,fVar71);
        auVar62._12_4_ = fVar106;
        auVar35._4_4_ = fVar178;
        auVar35._0_4_ = fVar175;
        auVar35._8_4_ = fVar185;
        auVar35._12_4_ = fVar188;
        auVar76 = minps(auVar62,auVar35);
        auVar76 = minps(auVar76,auVar81);
        auVar148._8_4_ = fVar73;
        auVar148._0_8_ = CONCAT44(fVar105,fVar71);
        auVar148._12_4_ = fVar106;
        auVar36._4_4_ = fVar178;
        auVar36._0_4_ = fVar175;
        auVar36._8_4_ = fVar185;
        auVar36._12_4_ = fVar188;
        auVar88 = maxps(auVar148,auVar36);
        auVar88 = maxps(auVar88,auVar81);
        fVar177 = ABS(auVar92._0_4_) * 1.1920929e-07;
        fVar180 = ABS(auVar92._4_4_) * 1.1920929e-07;
        fVar51 = ABS(auVar92._8_4_) * 1.1920929e-07;
        fVar70 = ABS(auVar92._12_4_) * 1.1920929e-07;
        auVar149._4_4_ = -(uint)(auVar88._4_4_ <= fVar180);
        auVar149._0_4_ = -(uint)(auVar88._0_4_ <= fVar177);
        auVar149._8_4_ = -(uint)(auVar88._8_4_ <= fVar51);
        auVar149._12_4_ = -(uint)(auVar88._12_4_ <= fVar70);
        in_XMM1._0_8_ = CONCAT44(fVar180,fVar177) ^ 0x8000000080000000;
        in_XMM1._8_4_ = -fVar51;
        in_XMM1._12_4_ = -fVar70;
        auVar63._4_4_ = -(uint)(-fVar180 <= auVar76._4_4_);
        auVar63._0_4_ = -(uint)(-fVar177 <= auVar76._0_4_);
        auVar63._8_4_ = -(uint)(in_XMM1._8_4_ <= auVar76._8_4_);
        auVar63._12_4_ = -(uint)(in_XMM1._12_4_ <= auVar76._12_4_);
        auVar149 = auVar149 | auVar63;
        iVar41 = movmskps((int)local_a30,auVar149);
        if (iVar41 != 0) {
          auVar101._0_4_ = fVar141 * fVar142 - fVar167 * fVar174;
          auVar101._4_4_ = fVar157 * fVar158 - fVar169 * fVar176;
          auVar101._8_4_ = fStack_a10 * fVar159 - fVar171 * fVar179;
          auVar101._12_4_ = fStack_a0c * fVar163 - fVar173 * fVar186;
          auVar162._0_4_ = fVar167 * fVar192 - fVar113 * fVar142;
          auVar162._4_4_ = fVar169 * fVar187 - fVar115 * fVar158;
          auVar162._8_4_ = fVar171 * fVar191 - fVar136 * fVar159;
          auVar162._12_4_ = fVar173 * fVar195 - fVar139 * fVar163;
          uVar40 = (uint)DAT_01f7b6c0;
          uVar131 = DAT_01f7b6c0._4_4_;
          uVar133 = DAT_01f7b6c0._8_4_;
          uVar135 = DAT_01f7b6c0._12_4_;
          auVar64._4_4_ =
               -(uint)((float)((uint)(fVar169 * fVar176) & uVar131) <
                      (float)((uint)(fVar115 * fVar158) & uVar131));
          auVar64._0_4_ =
               -(uint)((float)((uint)(fVar167 * fVar174) & uVar40) <
                      (float)((uint)(fVar113 * fVar142) & uVar40));
          auVar64._8_4_ =
               -(uint)((float)((uint)(fVar171 * fVar179) & uVar133) <
                      (float)((uint)(fVar136 * fVar159) & uVar133));
          auVar64._12_4_ =
               -(uint)((float)((uint)(fVar173 * fVar186) & uVar135) <
                      (float)((uint)(fVar139 * fVar163) & uVar135));
          local_8b8 = blendvps(auVar162,auVar101,auVar64);
          auVar104._0_4_ = fVar84 * fVar142 - fVar108 * fVar192;
          auVar104._4_4_ = fVar120 * fVar158 - fVar110 * fVar187;
          auVar104._8_4_ = fVar124 * fVar159 - fVar122 * fVar191;
          auVar104._12_4_ = fVar137 * fVar163 - fVar111 * fVar195;
          auVar65._4_4_ =
               -(uint)((float)((uint)(fVar112 * fVar158) & uVar131) <
                      (float)((uint)(fVar110 * fVar187) & uVar131));
          auVar65._0_4_ =
               -(uint)((float)((uint)(fVar126 * fVar142) & uVar40) <
                      (float)((uint)(fVar108 * fVar192) & uVar40));
          auVar65._8_4_ =
               -(uint)((float)((uint)(fVar140 * fVar159) & uVar133) <
                      (float)((uint)(fVar122 * fVar191) & uVar133));
          auVar65._12_4_ =
               -(uint)((float)((uint)(fVar132 * fVar163) & uVar135) <
                      (float)((uint)(fVar111 * fVar195) & uVar135));
          auVar37._4_4_ = fVar176 * fVar110 - fVar112 * fVar158;
          auVar37._0_4_ = fVar174 * fVar108 - fVar126 * fVar142;
          auVar37._8_4_ = fVar179 * fVar122 - fVar140 * fVar159;
          auVar37._12_4_ = fVar186 * fVar111 - fVar132 * fVar163;
          local_8a8 = blendvps(auVar104,auVar37,auVar65);
          auVar154._0_4_ = fVar126 * fVar167 - fVar108 * fVar141;
          auVar154._4_4_ = fVar112 * fVar169 - fVar110 * fVar157;
          auVar154._8_4_ = fVar140 * fVar171 - fVar122 * fStack_a10;
          auVar154._12_4_ = fVar132 * fVar173 - fVar111 * fStack_a0c;
          auVar118._0_4_ = fVar108 * fVar113 - fVar84 * fVar167;
          auVar118._4_4_ = fVar110 * fVar115 - fVar120 * fVar169;
          auVar118._8_4_ = fVar122 * fVar136 - fVar124 * fVar171;
          auVar118._12_4_ = fVar111 * fVar139 - fVar137 * fVar173;
          auVar66._4_4_ =
               -(uint)((float)((uint)(fVar110 * fVar157) & uVar131) <
                      (float)((uint)(fVar120 * fVar169) & uVar131));
          auVar66._0_4_ =
               -(uint)((float)((uint)(fVar108 * fVar141) & uVar40) <
                      (float)((uint)(fVar84 * fVar167) & uVar40));
          auVar66._8_4_ =
               -(uint)((float)((uint)(fVar122 * fStack_a10) & uVar133) <
                      (float)((uint)(fVar124 * fVar171) & uVar133));
          auVar66._12_4_ =
               -(uint)((float)((uint)(fVar111 * fStack_a0c) & uVar135) <
                      (float)((uint)(fVar137 * fVar173) & uVar135));
          local_898 = blendvps(auVar118,auVar154,auVar66);
          fVar84 = fVar95 * local_8b8._0_4_ + fVar96 * local_8a8._0_4_ + fVar50 * local_898._0_4_;
          fVar110 = fVar95 * local_8b8._4_4_ + fVar96 * local_8a8._4_4_ + fVar50 * local_898._4_4_;
          fVar120 = fVar95 * local_8b8._8_4_ + fVar96 * local_8a8._8_4_ + fVar50 * local_898._8_4_;
          fVar122 = fVar95 * local_8b8._12_4_ +
                    fVar96 * local_8a8._12_4_ + fVar50 * local_898._12_4_;
          fVar84 = fVar84 + fVar84;
          fVar110 = fVar110 + fVar110;
          fVar120 = fVar120 + fVar120;
          fVar122 = fVar122 + fVar122;
          auVar82._0_4_ = fVar102 * local_898._0_4_;
          auVar82._4_4_ = fVar107 * local_898._4_4_;
          auVar82._8_4_ = fVar116 * local_898._8_4_;
          auVar82._12_4_ = fVar85 * local_898._12_4_;
          fVar70 = fVar97 * local_8b8._0_4_ + fVar189 * local_8a8._0_4_ + auVar82._0_4_;
          fVar102 = fVar119 * local_8b8._4_4_ + fVar193 * local_8a8._4_4_ + auVar82._4_4_;
          fVar107 = fVar121 * local_8b8._8_4_ + fVar190 * local_8a8._8_4_ + auVar82._8_4_;
          fVar108 = fVar123 * local_8b8._12_4_ + fVar194 * local_8a8._12_4_ + auVar82._12_4_;
          auVar34._4_4_ = fVar110;
          auVar34._0_4_ = fVar84;
          auVar34._8_4_ = fVar120;
          auVar34._12_4_ = fVar122;
          auVar76 = rcpps(auVar82,auVar34);
          fVar50 = auVar76._0_4_;
          fVar177 = auVar76._4_4_;
          fVar180 = auVar76._8_4_;
          fVar51 = auVar76._12_4_;
          local_8c8._0_4_ = ((1.0 - fVar84 * fVar50) * fVar50 + fVar50) * (fVar70 + fVar70);
          local_8c8._4_4_ = ((1.0 - fVar110 * fVar177) * fVar177 + fVar177) * (fVar102 + fVar102);
          local_8c8._8_4_ = ((1.0 - fVar120 * fVar180) * fVar180 + fVar180) * (fVar107 + fVar107);
          local_8c8._12_4_ = ((1.0 - fVar122 * fVar51) * fVar51 + fVar51) * (fVar108 + fVar108);
          fVar50 = *(float *)(ray + k * 4 + 0x80);
          fVar177 = *(float *)(ray + k * 4 + 0x30);
          in_XMM1._0_4_ =
               -(uint)(local_8c8._0_4_ <= fVar50 && fVar177 <= local_8c8._0_4_) & auVar149._0_4_;
          in_XMM1._4_4_ =
               -(uint)(local_8c8._4_4_ <= fVar50 && fVar177 <= local_8c8._4_4_) & auVar149._4_4_;
          in_XMM1._8_4_ =
               (float)(-(uint)(local_8c8._8_4_ <= fVar50 && fVar177 <= local_8c8._8_4_) &
                      auVar149._8_4_);
          in_XMM1._12_4_ =
               (float)(-(uint)(local_8c8._12_4_ <= fVar50 && fVar177 <= local_8c8._12_4_) &
                      auVar149._12_4_);
          iVar41 = movmskps(iVar41,in_XMM1);
          if (iVar41 != 0) {
            in_XMM1._0_4_ = in_XMM1._0_4_ & -(uint)(fVar84 != 0.0);
            in_XMM1._4_4_ = in_XMM1._4_4_ & -(uint)(fVar110 != 0.0);
            in_XMM1._8_4_ = (float)((uint)in_XMM1._8_4_ & -(uint)(fVar120 != 0.0));
            in_XMM1._12_4_ = (float)((uint)in_XMM1._12_4_ & -(uint)(fVar122 != 0.0));
            uVar40 = movmskps(*(uint *)(pGVar46 + 0x14) * 0xc,in_XMM1);
            if (uVar40 != 0) {
              uVar131 = *(uint *)(pGVar46 + 0x18);
              uVar21 = *(undefined4 *)(pGVar46 + 0x1c);
              pGVar25 = (context->scene->geometries).items[uVar131].ptr;
              if ((pGVar25->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar25->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_002940f7:
                  *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                  return bVar49;
                }
                auVar76 = *(undefined1 (*) [16])local_a30;
                auVar75 = auVar76._0_12_;
                auVar88 = *(undefined1 (*) [16])(local_a30 + uVar39 * 4);
                auVar53 = auVar88._0_12_;
                if (uVar39 == 2) {
                  auVar75._0_8_ = auVar76._0_8_;
                  auVar75._8_4_ = auVar76._4_4_;
                  auVar53._0_8_ = auVar88._0_8_;
                  auVar53._8_4_ = auVar88._4_4_;
                }
                auVar76 = rcpps(auVar92,auVar92);
                fVar177 = auVar76._0_4_;
                fVar180 = auVar76._4_4_;
                fVar51 = auVar76._8_4_;
                fVar70 = auVar76._12_4_;
                fVar177 = (float)(-(uint)(1e-18 <= ABS(auVar92._0_4_)) &
                                 (uint)(((float)DAT_01f7ba10 - auVar92._0_4_ * fVar177) * fVar177 +
                                       fVar177));
                fVar180 = (float)(-(uint)(1e-18 <= ABS(auVar92._4_4_)) &
                                 (uint)((DAT_01f7ba10._4_4_ - auVar92._4_4_ * fVar180) * fVar180 +
                                       fVar180));
                fVar51 = (float)(-(uint)(1e-18 <= ABS(auVar92._8_4_)) &
                                (uint)((DAT_01f7ba10._8_4_ - auVar92._8_4_ * fVar51) * fVar51 +
                                      fVar51));
                fVar70 = (float)(-(uint)(1e-18 <= ABS(auVar92._12_4_)) &
                                (uint)((DAT_01f7ba10._12_4_ - auVar92._12_4_ * fVar70) * fVar70 +
                                      fVar70));
                auVar184._0_4_ = fVar71 * fVar177;
                auVar184._4_4_ = fVar105 * fVar180;
                auVar184._8_4_ = fVar73 * fVar51;
                auVar184._12_4_ = fVar106 * fVar70;
                auVar183 = minps(auVar184,_DAT_01f7ba10);
                auVar129._0_4_ = fVar175 * fVar177;
                auVar129._4_4_ = fVar178 * fVar180;
                auVar129._8_4_ = fVar185 * fVar51;
                auVar129._12_4_ = fVar188 * fVar70;
                auVar128 = minps(auVar129,_DAT_01f7ba10);
                auVar83._4_4_ = auVar75._4_4_;
                auVar94._0_8_ = auVar75._0_8_;
                auVar83._8_4_ = auVar75._8_4_;
                auVar94._8_4_ = auVar83._4_4_;
                uVar135 = auVar53._4_4_;
                auVar94._12_4_ = uVar135;
                uVar133 = auVar53._0_4_;
                auVar93._8_8_ = auVar94._8_8_;
                auVar93._0_4_ = auVar75._0_4_;
                auVar93._4_4_ = uVar133;
                auVar83._0_4_ = auVar83._4_4_;
                auVar83._12_4_ = auVar83._8_4_;
                auVar67._0_8_ = auVar53._0_8_;
                auVar67._8_4_ = uVar135;
                auVar67._12_4_ = auVar53._8_4_;
                auVar99 = pblendw(auVar93,ZEXT816(0),0xaa);
                auVar88 = pblendw(auVar83,_DAT_01f7aa10,0xaa);
                auVar76 = pblendw(auVar67,_DAT_01f7aa10,0xaa);
                fVar106 = auVar183._0_4_;
                fVar107 = auVar183._4_4_;
                fVar108 = auVar183._8_4_;
                fVar84 = auVar183._12_4_;
                fVar71 = auVar128._0_4_;
                fVar102 = auVar128._4_4_;
                fVar105 = auVar128._8_4_;
                fVar73 = auVar128._12_4_;
                fVar177 = (1.0 - fVar106) - fVar71;
                fVar180 = (1.0 - fVar107) - fVar102;
                fVar51 = (1.0 - fVar108) - fVar105;
                fVar70 = (1.0 - fVar84) - fVar73;
                local_8e8[0] = (float)auVar99._0_4_ * 0.00012207031 * fVar177 +
                               (float)auVar76._0_4_ * 0.00012207031 * fVar71 +
                               (float)auVar88._0_4_ * 0.00012207031 * fVar106;
                local_8e8[1] = (float)auVar99._4_4_ * 0.00012207031 * fVar180 +
                               (float)auVar76._4_4_ * 0.00012207031 * fVar102 +
                               (float)auVar88._4_4_ * 0.00012207031 * fVar107;
                local_8e8[2] = (float)auVar99._8_4_ * 0.00012207031 * fVar51 +
                               (float)auVar76._8_4_ * 0.00012207031 * fVar105 +
                               (float)auVar88._8_4_ * 0.00012207031 * fVar108;
                local_8e8[3] = (float)auVar99._12_4_ * 0.00012207031 * fVar70 +
                               (float)auVar76._12_4_ * 0.00012207031 * fVar73 +
                               (float)auVar88._12_4_ * 0.00012207031 * fVar84;
                local_8d8[0] = fVar177 * (float)(auVar93._0_4_ >> 0x10) * 0.00012207031 +
                               (float)(uVar133 >> 0x10) * 0.00012207031 * fVar71 +
                               (float)(auVar83._4_4_ >> 0x10) * 0.00012207031 * fVar106;
                local_8d8[1] = fVar180 * (float)(uVar133 >> 0x10) * 0.00012207031 +
                               (float)(uVar135 >> 0x10) * 0.00012207031 * fVar102 +
                               (float)(auVar83._4_4_ >> 0x10) * 0.00012207031 * fVar107;
                local_8d8[2] = fVar51 * (float)(auVar83._4_4_ >> 0x10) * 0.00012207031 +
                               (float)(uVar135 >> 0x10) * 0.00012207031 * fVar105 +
                               (float)(auVar83._8_4_ >> 0x10) * 0.00012207031 * fVar108;
                local_8d8[3] = fVar70 * (float)(uVar135 >> 0x10) * 0.00012207031 +
                               (float)(auVar53._8_4_ >> 0x10) * 0.00012207031 * fVar73 +
                               (float)(auVar83._8_4_ >> 0x10) * 0.00012207031 * fVar84;
                uVar44 = (ulong)(uVar40 & 0xff);
                uVar42 = 0;
                if (uVar44 != 0) {
                  for (; ((uVar40 & 0xff) >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                  }
                }
                local_b18 = CONCAT44(uVar131,uVar131);
                local_b58 = CONCAT44(uVar21,uVar21);
                auVar74 = *local_a08;
                fStack_b1c = (float)((ulong)*(undefined8 *)(*local_a08 + 8) >> 0x20);
                local_a28 = uVar39;
                do {
                  local_858 = local_8e8[uVar42];
                  fVar177 = local_8d8[uVar42];
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_8c8 + uVar42 * 4);
                  args.context = context->user;
                  local_848._4_4_ = fVar177;
                  local_848._0_4_ = fVar177;
                  local_848._8_4_ = fVar177;
                  local_848._12_4_ = fVar177;
                  local_888 = *(undefined4 *)(local_8b8 + uVar42 * 4);
                  uVar22 = *(undefined4 *)(local_8a8 + uVar42 * 4);
                  uVar23 = *(undefined4 *)(local_898 + uVar42 * 4);
                  local_878._4_4_ = uVar22;
                  local_878._0_4_ = uVar22;
                  local_878._8_4_ = uVar22;
                  local_878._12_4_ = uVar22;
                  local_868._4_4_ = uVar23;
                  local_868._0_4_ = uVar23;
                  local_868._8_4_ = uVar23;
                  local_868._12_4_ = uVar23;
                  uStack_884 = local_888;
                  uStack_880 = local_888;
                  uStack_87c = local_888;
                  fStack_854 = local_858;
                  fStack_850 = local_858;
                  fStack_84c = local_858;
                  local_838 = local_b58;
                  uStack_830 = CONCAT44(uVar21,uVar21);
                  local_828 = local_b18;
                  uStack_820 = CONCAT44(uVar131,uVar131);
                  local_818 = (args.context)->instID[0];
                  uStack_814 = local_818;
                  uStack_810 = local_818;
                  uStack_80c = local_818;
                  local_808 = (args.context)->instPrimID[0];
                  uStack_804 = local_808;
                  uStack_800 = local_808;
                  uStack_7fc = local_808;
                  local_a58._12_4_ = fStack_b1c;
                  local_a58._0_12_ = auVar74;
                  args.valid = (int *)local_a58;
                  args.geometryUserPtr = pGVar25->userPtr;
                  args.hit = (RTCHitN *)&local_888;
                  args.N = 4;
                  args.ray = (RTCRayN *)ray;
                  if (pGVar25->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar25->occlusionFilterN)(&args);
                  }
                  if (local_a58 == (undefined1  [16])0x0) {
                    auVar69._8_4_ = 0xffffffff;
                    auVar69._0_8_ = 0xffffffffffffffff;
                    auVar69._12_4_ = 0xffffffff;
                    in_XMM1 = auVar69 ^ _DAT_01f7ae20;
                  }
                  else {
                    p_Var26 = context->args->filter;
                    if ((p_Var26 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar25->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var26)(&args);
                    }
                    auVar68._0_4_ = -(uint)(local_a58._0_4_ == 0);
                    auVar68._4_4_ = -(uint)(local_a58._4_4_ == 0);
                    auVar68._8_4_ = -(uint)(local_a58._8_4_ == 0);
                    auVar68._12_4_ = -(uint)(local_a58._12_4_ == 0);
                    in_XMM1 = auVar68 ^ _DAT_01f7ae20;
                    auVar76 = blendvps(_DAT_01f7aa00,*(undefined1 (*) [16])(args.ray + 0x80),auVar68
                                      );
                    *(undefined1 (*) [16])(args.ray + 0x80) = auVar76;
                  }
                  if ((_DAT_01f7bb20 & in_XMM1) != (undefined1  [16])0x0) goto LAB_002940f7;
                  *(float *)(ray + k * 4 + 0x80) = fVar50;
                  uVar44 = uVar44 ^ 1L << (uVar42 & 0x3f);
                  uVar42 = 0;
                  if (uVar44 != 0) {
                    for (; (uVar44 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                    }
                  }
                } while (uVar44 != 0);
              }
            }
          }
        }
      }
    }
    else {
      sVar27 = *(size_t *)*(GridSOA **)(uVar42 & 0xfffffffffffffff0);
      (local_a38->super_Precalculations).grid = *(GridSOA **)(uVar42 & 0xfffffffffffffff0);
      if (sVar27 != 0) {
        local_a40->ptr = sVar27;
        local_a40 = local_a40 + 1;
      }
    }
LAB_00293f1d:
    bVar49 = local_a40 != stack;
    if (!bVar49) {
      return bVar49;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }